

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_helper.c
# Opt level: O3

_Bool arm_debug_check_watchpoint_arm(CPUState *cs,CPUWatchpoint *wp)

{
  _Bool _Var1;
  _Bool _Var2;
  ARMCPU *cpu;
  int n;
  bool bVar3;
  
  if ((*(byte *)((long)cs[1].tb_jmp_cache + 0x27e1) & 0x80) == 0) {
    return false;
  }
  _Var1 = arm_generate_debug_exceptions((CPUARMState *)(cs[1].tb_jmp_cache + 0x3ff));
  _Var2 = false;
  n = 0;
  if (_Var1) {
    do {
      _Var2 = bp_wp_matches((ARMCPU *)cs,n,true);
      if (_Var2) {
        return _Var2;
      }
      bVar3 = n != 0xf;
      n = n + 1;
    } while (bVar3);
  }
  return _Var2;
}

Assistant:

static bool check_watchpoints(ARMCPU *cpu)
{
    CPUARMState *env = &cpu->env;
    int n;

    /*
     * If watchpoints are disabled globally or we can't take debug
     * exceptions here then watchpoint firings are ignored.
     */
    if (extract32(env->cp15.mdscr_el1, 15, 1) == 0
        || !arm_generate_debug_exceptions(env)) {
        return false;
    }

    for (n = 0; n < ARRAY_SIZE(env->cpu_watchpoint); n++) {
        if (bp_wp_matches(cpu, n, true)) {
            return true;
        }
    }
    return false;
}